

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

size_type __thiscall
ft::multimap<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::erase
          (multimap<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  size_type sVar3;
  bool bVar4;
  undefined1 local_88 [8];
  iterator first;
  iterator local_58;
  undefined1 local_40 [8];
  iterator last;
  
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::lower_bound
            ((iterator *)local_88,
             &this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>,k);
  mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::upper_bound
            ((iterator *)local_40,
             &this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>,k);
  if (first.m_tree == last.m_tree) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    do {
      ptVar2 = (treeNode<ft::pair<const_int,_int>_> *)first.m_tree;
      ptVar1 = (first.m_tree)->m_last;
      if ((first.m_tree)->m_last == (treeNode<ft::pair<const_int,_int>_> *)*first._vptr_treeIterator
         ) {
        do {
          first.m_tree = (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                          *)ptVar2->parent;
          bVar4 = (first.m_tree)->m_last == ptVar2;
          ptVar2 = (treeNode<ft::pair<const_int,_int>_> *)first.m_tree;
        } while (bVar4);
      }
      else {
        do {
          first.m_tree = (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                          *)ptVar1;
          ptVar1 = ((treeNode<ft::pair<const_int,_int>_> *)first.m_tree)->left;
        } while (((treeNode<ft::pair<const_int,_int>_> *)first.m_tree)->left !=
                 (treeNode<ft::pair<const_int,_int>_> *)*first._vptr_treeIterator);
      }
      sVar3 = sVar3 + 1;
    } while (first.m_tree != last.m_tree);
  }
  first.m_node = (treeNode<ft::pair<const_int,_int>_> *)&PTR__treeIterator_00118940;
  local_58._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00118940;
  local_58.m_tree =
       (RBTree<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_> *
       )last._vptr_treeIterator;
  local_58.m_node = (treeNode<ft::pair<const_int,_int>_> *)last.m_tree;
  erase(this,(iterator *)&first.m_node,&local_58);
  return sVar3;
}

Assistant:

size_type	erase(key_type const & k)
	{
		iterator	first = this->lower_bound(k);
		iterator	last = this->upper_bound(k);
		size_type	ret = ft::distance(first, last);

		this->erase(first, last);
		return ret;
	}